

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::emit_wave_quad_op_instruction(Impl *impl,CallInst *instruction)

{
  Builder *value;
  CallInst *pCVar1;
  bool bVar2;
  Id IVar3;
  Value *pVVar4;
  Operation *local_38;
  Operation *op;
  Builder *pBStack_28;
  uint32_t swap_kind;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  pBStack_28 = Converter::Impl::builder(impl);
  pCVar1 = instruction_local;
  value = builder;
  if (((ulong)instruction_local[0xc].super_Instruction.operands.
              super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) == 0) {
    bVar2 = get_constant_operand((Instruction *)builder,2,(uint32_t *)((long)&op + 4));
    if (bVar2) {
      bVar2 = execution_model_can_quad_op
                        ((ExecutionModel)
                         instruction_local[1].super_Instruction.attachments._M_h._M_rehash_policy.
                         _M_next_resize);
      if (bVar2) {
        local_38 = Converter::Impl::allocate
                             ((Impl *)instruction_local,OpGroupNonUniformQuadSwap,(Value *)builder);
        IVar3 = spv::Builder::makeUintConstant(pBStack_28,3,false);
        Operation::add_id(local_38,IVar3);
        pCVar1 = instruction_local;
        pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
        IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
        Operation::add_id(local_38,IVar3);
        IVar3 = spv::Builder::makeUintConstant(pBStack_28,op._4_4_,false);
        Operation::add_id(local_38,IVar3);
        spv::Builder::addCapability(pBStack_28,CapabilityGroupNonUniformQuad);
      }
      else {
        local_38 = Converter::Impl::allocate
                             ((Impl *)instruction_local,OpGroupNonUniformShuffleXor,(Value *)builder
                             );
        IVar3 = spv::Builder::makeUintConstant(pBStack_28,3,false);
        Operation::add_id(local_38,IVar3);
        pCVar1 = instruction_local;
        pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
        IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
        Operation::add_id(local_38,IVar3);
        IVar3 = spv::Builder::makeUintConstant(pBStack_28,op._4_4_ + 1,false);
        Operation::add_id(local_38,IVar3);
        spv::Builder::addCapability(pBStack_28,CapabilityGroupNonUniformShuffle);
      }
      Converter::Impl::add((Impl *)instruction_local,local_38,false);
      impl_local._7_1_ = true;
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  else {
    pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
    Converter::Impl::rewrite_value((Impl *)pCVar1,(Value *)value,IVar3);
    impl_local._7_1_ = true;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_wave_quad_op_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	if (impl.execution_mode_meta.synthesize_dummy_derivatives)
	{
		impl.rewrite_value(instruction, impl.get_id_for_value(instruction->getOperand(1)));
		return true;
	}

	// Matches with SPIR-V.
	uint32_t swap_kind;
	if (!get_constant_operand(instruction, 2, &swap_kind))
		return false;

	Operation *op;
	if (execution_model_can_quad_op(impl.execution_model))
	{
		op = impl.allocate(spv::OpGroupNonUniformQuadSwap, instruction);
		op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		op->add_id(builder.makeUintConstant(swap_kind));
		builder.addCapability(spv::CapabilityGroupNonUniformQuad);
	}
	else
	{
		// Use ShuffleXor for non-fragment stages.
		op = impl.allocate(spv::OpGroupNonUniformShuffleXor, instruction);
		op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
		op->add_id(impl.get_id_for_value(instruction->getOperand(1)));

		// 1: Horizontal, 2: Vertical, 3: Diagonal.
		op->add_id(builder.makeUintConstant(swap_kind + 1));
		builder.addCapability(spv::CapabilityGroupNonUniformShuffle);
	}

	impl.add(op);
	return true;
}